

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void store_pc_exc_ret(DisasContext_conflict1 *s,TCGv_i32 pc)

{
  TCGContext_conflict1 *tcg_ctx;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  tcg_gen_mov_i32(tcg_ctx,tcg_ctx->cpu_R[0xf],pc);
  tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(pc + (long)tcg_ctx));
  return;
}

Assistant:

static void store_pc_exc_ret(DisasContext *s, TCGv_i32 pc)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    tcg_gen_mov_i32(tcg_ctx, tcg_ctx->cpu_R[15], pc);
    tcg_temp_free_i32(tcg_ctx, pc);
}